

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O0

RequestBuilder * __thiscall
restincurl::RequestBuilder::SendData<std::__cxx11::string>
          (RequestBuilder *this,
          OutDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *dh)

{
  pointer pOVar1;
  OutDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_28;
  CURLoption local_20 [2];
  OutDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_18;
  OutDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *dh_local;
  RequestBuilder *this_local;
  
  local_18 = dh;
  dh_local = (OutDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)this;
  if (((this->is_built_ ^ 0xffU) & 1) == 0) {
    __assert_fail("!is_built_",
                  "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                  ,0x590,
                  "RequestBuilder &restincurl::RequestBuilder::SendData(OutDataHandler<T> &) [T = std::basic_string<char>]"
                 );
  }
  pOVar1 = std::unique_ptr<restincurl::Options,_std::default_delete<restincurl::Options>_>::
           operator->(&this->options_);
  local_20[1] = 0x4e2c;
  Options::Set<unsigned_long(char*,unsigned_long,unsigned_long,void*)>
            (pOVar1,local_20 + 1,
             OutDataHandler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::read_callback);
  pOVar1 = std::unique_ptr<restincurl::Options,_std::default_delete<restincurl::Options>_>::
           operator->(&this->options_);
  local_20[0] = CURLOPT_READDATA;
  local_28 = local_18;
  Options::Set<restincurl::OutDataHandler<std::__cxx11::string>*>(pOVar1,local_20,&local_28);
  this->have_data_out_ = true;
  return this;
}

Assistant:

RequestBuilder& SendData(OutDataHandler<T>& dh) {
            assert(!is_built_);
            options_->Set(CURLOPT_READFUNCTION, dh.read_callback);
            options_->Set(CURLOPT_READDATA, &dh);
            have_data_out_ = true;
            return *this;
        }